

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

optional<pbrt::QuadricIntersection> * __thiscall
pbrt::Sphere::BasicIntersect(Sphere *this,Ray *r,Float tMax)

{
  float fVar1;
  undefined8 uVar2;
  Tuple3<pbrt::Vector3,_pbrt::Interval> t;
  Interval i;
  Interval i_00;
  Vector3<float> v_00;
  Point3<pbrt::Interval> p;
  Point3<pbrt::Interval> p_00;
  Vector3<pbrt::Interval> v_01;
  Point3<pbrt::Interval> p_01;
  Vector3<pbrt::Interval> v_02;
  Vector3f p_02;
  Tuple3<pbrt::Vector3,_float> t_00;
  Tuple3<pbrt::Vector3,_float> t_01;
  Vector3<pbrt::Interval> v_03;
  Vector3<pbrt::Interval> v_04;
  Point3<float> p2;
  Point3<float> p1;
  Point3<float> p1_00;
  bool bVar3;
  long in_RDX;
  Float *in_RSI;
  optional<pbrt::QuadricIntersection> *in_RDI;
  float in_XMM0_Da;
  Float FVar4;
  Float FVar5;
  type tVar6;
  double dVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar45 [56];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  Vector3<float> VVar46;
  Point3<float> PVar47;
  Interval tShapeHit;
  Interval q;
  Interval rootDiscrim;
  Interval discrim;
  Interval length;
  Vector3fi v;
  Interval c;
  Interval b;
  Interval a;
  Interval t1;
  Interval t0;
  Vector3fi di;
  Point3fi oi;
  Point3f pHit;
  Float phi;
  Interval IVar48;
  Interval *in_stack_fffffffffffffa00;
  Interval *this_00;
  Interval IVar49;
  Interval in_stack_fffffffffffffa08;
  Interval IVar50;
  Point3<float> *this_01;
  undefined4 in_stack_fffffffffffffa10;
  float in_stack_fffffffffffffa14;
  Float in_stack_fffffffffffffa18;
  Float in_stack_fffffffffffffa1c;
  Interval in_stack_fffffffffffffa20;
  undefined1 *puVar51;
  float in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa2c;
  float in_stack_fffffffffffffa30;
  Float in_stack_fffffffffffffa34;
  undefined1 *puVar52;
  optional<pbrt::QuadricIntersection> *poVar53;
  undefined1 *puVar54;
  float fVar55;
  Interval *this_02;
  Interval i_01;
  float fVar56;
  undefined1 local_44c [12];
  ulong local_440;
  float local_438;
  Interval local_430;
  undefined8 local_428;
  undefined4 local_420;
  ulong local_418;
  float local_410;
  undefined8 local_404;
  undefined4 local_3fc;
  ulong local_3f8;
  float local_3f0;
  ulong local_3e8;
  float local_3e0;
  undefined8 local_3d8;
  float local_3d0;
  undefined8 local_3c8;
  float local_3c0;
  undefined8 local_3b8;
  undefined4 local_3b0;
  Interval local_3a8;
  Interval IStack_3a0;
  Point3<float> *local_398;
  undefined8 local_384;
  undefined4 local_37c;
  undefined8 local_378;
  undefined4 local_370;
  undefined8 local_368;
  float local_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined1 local_334 [12];
  ulong local_328;
  float local_320;
  Interval local_318;
  undefined8 local_310;
  Interval local_308;
  undefined8 local_300;
  Interval local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  Interval local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  Interval local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  Interval local_288;
  undefined8 local_280;
  Vector3fi *in_stack_fffffffffffffd88;
  Transform *in_stack_fffffffffffffd90;
  Interval local_260;
  undefined8 local_258;
  Interval *pIStack_250;
  Interval local_248;
  undefined8 local_240;
  Interval local_238;
  Interval IStack_230;
  Point3<float> *local_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 local_1b8;
  Interval *pIStack_1b0;
  Interval local_1a8;
  Interval local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  Point3fi *in_stack_fffffffffffffee8;
  Transform *in_stack_fffffffffffffef0;
  Interval local_c0;
  Interval local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined1 local_90 [24];
  Interval local_78;
  Interval IStack_70;
  Point3<float> *local_68;
  undefined1 local_60 [24];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 local_30;
  float local_28;
  float local_20;
  float local_1c;
  long local_18;
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_15 [56];
  undefined1 extraout_var_16 [56];
  undefined1 extraout_var_17 [56];
  undefined1 extraout_var_18 [56];
  undefined1 extraout_var_19 [56];
  undefined1 extraout_var_20 [56];
  undefined1 extraout_var_21 [56];
  undefined1 extraout_var_22 [56];
  undefined1 extraout_var_23 [56];
  undefined1 extraout_var_24 [56];
  undefined1 extraout_var_25 [56];
  undefined1 extraout_var_26 [56];
  undefined1 extraout_var_27 [56];
  undefined1 extraout_var_28 [56];
  undefined1 extraout_var_29 [56];
  undefined1 extraout_var_30 [56];
  undefined1 extraout_var_31 [56];
  
  poVar53 = in_RDI;
  local_1c = in_XMM0_Da;
  local_18 = in_RDX;
  Point3<float>::Point3((Point3<float> *)0x6a5052);
  IVar49 = *(Interval *)(in_RSI + 8);
  puVar54 = local_60;
  Point3fi::Point3fi((Point3fi *)in_stack_fffffffffffffa20,
                     (Point3f *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
  Transform::operator()(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  fVar55 = (float)*(undefined8 *)(in_RSI + 8);
  FVar4 = (Float)((ulong)*(undefined8 *)(in_RSI + 8) >> 0x20);
  local_a8 = *(undefined4 *)(local_18 + 0x14);
  local_b0 = *(undefined8 *)(local_18 + 0xc);
  IVar48 = (Interval)local_90;
  p_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffa2c;
  p_02.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffa28;
  p_02.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffa30;
  local_a0 = local_b0;
  local_98 = local_a8;
  Vector3fi::Vector3fi
            ((Vector3fi *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),p_02);
  this_02 = &local_78;
  Transform::operator()(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  auVar8._0_8_ = Sqr(in_stack_fffffffffffffa08);
  auVar8._8_56_ = extraout_var;
  vmovlpd_avx(auVar8._0_16_);
  i_01 = (Interval)&IStack_70;
  auVar9._0_8_ = Sqr(in_stack_fffffffffffffa08);
  auVar9._8_56_ = extraout_var_00;
  vmovlpd_avx(auVar9._0_16_);
  auVar10._0_8_ = Interval::operator+(in_stack_fffffffffffffa00,in_stack_fffffffffffffa08);
  auVar10._8_56_ = extraout_var_01;
  vmovlpd_avx(auVar10._0_16_);
  fVar56 = SUB84(&local_68,0);
  auVar11._0_8_ = Sqr(in_stack_fffffffffffffa08);
  auVar11._8_56_ = extraout_var_02;
  vmovlpd_avx(auVar11._0_16_);
  auVar12._0_8_ = Interval::operator+(in_stack_fffffffffffffa00,in_stack_fffffffffffffa08);
  auVar12._8_56_ = extraout_var_03;
  uVar2 = vmovlpd_avx(auVar12._0_16_);
  local_128 = local_48;
  auVar13._0_8_ = Interval::operator*((Interval *)CONCAT44(FVar4,fVar55),IVar48);
  auVar13._8_56_ = extraout_var_04;
  local_120 = vmovlpd_avx(auVar13._0_16_);
  local_138 = uStack_40;
  auVar14._0_8_ = Interval::operator*((Interval *)CONCAT44(FVar4,fVar55),IVar48);
  auVar14._8_56_ = extraout_var_05;
  local_130 = vmovlpd_avx(auVar14._0_16_);
  auVar15._0_8_ = Interval::operator+(in_stack_fffffffffffffa00,in_stack_fffffffffffffa08);
  auVar15._8_56_ = extraout_var_06;
  vmovlpd_avx(auVar15._0_16_);
  local_148 = local_38;
  auVar16._0_8_ = Interval::operator*((Interval *)CONCAT44(FVar4,fVar55),IVar48);
  auVar16._8_56_ = extraout_var_07;
  local_140 = vmovlpd_avx(auVar16._0_16_);
  auVar17._0_8_ = Interval::operator+(in_stack_fffffffffffffa00,in_stack_fffffffffffffa08);
  auVar17._8_56_ = extraout_var_08;
  vmovlpd_avx(auVar17._0_16_);
  IVar50.high = in_stack_fffffffffffffa1c;
  IVar50.low = in_stack_fffffffffffffa18;
  auVar18._0_8_ = pbrt::operator*(in_stack_fffffffffffffa14,IVar50);
  auVar18._8_56_ = extraout_var_09;
  vmovlpd_avx(auVar18._0_16_);
  local_170 = local_48;
  auVar19._0_8_ = Sqr(in_stack_fffffffffffffa08);
  auVar19._8_56_ = extraout_var_10;
  local_168 = vmovlpd_avx(auVar19._0_16_);
  local_180 = uStack_40;
  auVar20._0_8_ = Sqr(in_stack_fffffffffffffa08);
  auVar20._8_56_ = extraout_var_11;
  local_178 = vmovlpd_avx(auVar20._0_16_);
  auVar21._0_8_ = Interval::operator+(in_stack_fffffffffffffa00,in_stack_fffffffffffffa08);
  auVar21._8_56_ = extraout_var_12;
  local_160 = vmovlpd_avx(auVar21._0_16_);
  local_190 = local_38;
  auVar22._0_8_ = Sqr(in_stack_fffffffffffffa08);
  auVar22._8_56_ = extraout_var_13;
  local_188 = vmovlpd_avx(auVar22._0_16_);
  auVar23._0_8_ = Interval::operator+(in_stack_fffffffffffffa00,in_stack_fffffffffffffa08);
  auVar23._8_56_ = extraout_var_14;
  local_158 = vmovlpd_avx(auVar23._0_16_);
  Interval::Interval(&local_1a0,*in_RSI);
  auVar24._0_8_ = Sqr(in_stack_fffffffffffffa08);
  auVar24._8_56_ = extraout_var_15;
  local_198 = vmovlpd_avx(auVar24._0_16_);
  auVar25._0_8_ = Interval::operator-(in_stack_fffffffffffffa00,in_stack_fffffffffffffa08);
  auVar25._8_56_ = extraout_var_16;
  local_150 = vmovlpd_avx(auVar25._0_16_);
  i.high = in_stack_fffffffffffffa1c;
  i.low = in_stack_fffffffffffffa18;
  local_220 = uVar2;
  auVar26._0_8_ = pbrt::operator*(in_stack_fffffffffffffa14,i);
  auVar26._8_56_ = extraout_var_17;
  local_218 = vmovlpd_avx(auVar26._0_16_);
  auVar27._0_8_ = Interval::operator/(this_02,i_01);
  auVar27._8_56_ = extraout_var_18;
  local_210 = vmovlpd_avx(auVar27._0_16_);
  local_228 = local_68;
  local_238 = local_78;
  IStack_230 = IStack_70;
  t.x.high = in_stack_fffffffffffffa14;
  t.x.low = (Float)in_stack_fffffffffffffa10;
  t.y.low = in_stack_fffffffffffffa18;
  t.y.high = in_stack_fffffffffffffa1c;
  t.z = in_stack_fffffffffffffa20;
  pbrt::operator*(IStack_70,t);
  v_04.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.y = (Interval)puVar54;
  v_04.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x = IVar49;
  v_04.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.z.low = fVar55;
  v_04.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.z.high = FVar4;
  Point3fi::operator-((Point3fi *)in_RDI,v_04);
  local_1c8 = local_1e0;
  local_1d8 = local_1f0;
  uStack_1d0 = uStack_1e8;
  p.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = in_stack_fffffffffffffa28;
  p.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x = in_stack_fffffffffffffa20;
  p.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = (Float)in_stack_fffffffffffffa2c;
  p.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low = in_stack_fffffffffffffa30;
  p.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high = in_stack_fffffffffffffa34;
  Vector3fi::Vector3fi<pbrt::Interval>
            ((Vector3fi *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),p);
  local_248 = local_1a8;
  local_258 = local_1b8;
  pIStack_250 = pIStack_1b0;
  v_03.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.y = (Interval)poVar53;
  v_03.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x = (Interval)in_RDI;
  v_03.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.z = IVar49;
  this_00 = pIStack_1b0;
  IVar50 = local_1a8;
  auVar28._0_8_ = Length<pbrt::Interval>(v_03);
  auVar28._8_56_ = extraout_var_19;
  local_240 = vmovlpd_avx(auVar28._0_16_);
  IVar49.high = in_stack_fffffffffffffa1c;
  IVar49.low = in_stack_fffffffffffffa18;
  auVar29._0_8_ = pbrt::operator*(in_stack_fffffffffffffa14,IVar49);
  auVar29._8_56_ = extraout_var_20;
  vmovlpd_avx(auVar29._0_16_);
  Interval::Interval(&local_288,*in_RSI);
  local_290 = local_240;
  auVar30._0_8_ = Interval::operator+(this_00,IVar50);
  auVar30._8_56_ = extraout_var_21;
  local_280 = vmovlpd_avx(auVar30._0_16_);
  auVar31._0_8_ = Interval::operator*((Interval *)CONCAT44(FVar4,fVar55),IVar48);
  auVar31._8_56_ = extraout_var_22;
  vmovlpd_avx(auVar31._0_16_);
  Interval::Interval(&local_2a0,*in_RSI);
  local_2a8 = local_240;
  auVar32._0_8_ = Interval::operator-(this_00,IVar50);
  auVar32._8_56_ = extraout_var_23;
  local_298 = vmovlpd_avx(auVar32._0_16_);
  auVar33._0_8_ = Interval::operator*((Interval *)CONCAT44(FVar4,fVar55),IVar48);
  auVar33._8_56_ = extraout_var_24;
  local_260 = (Interval)vmovlpd_avx(auVar33._0_16_);
  FVar4 = Interval::LowerBound(&local_260);
  if (FVar4 < 0.0) {
    memset(in_RDI,0,0x18);
    pstd::optional<pbrt::QuadricIntersection>::optional(in_RDI);
  }
  else {
    local_2b8 = local_260;
    auVar34._0_8_ = Sqrt(IVar50);
    auVar34._8_56_ = extraout_var_25;
    local_2b0 = vmovlpd_avx(auVar34._0_16_);
    FVar4 = Interval::operator_cast_to_float((Interval *)0x6a56d9);
    if (0.0 <= FVar4) {
      local_2f0 = local_2b0;
      auVar37._0_8_ = Interval::operator+(this_00,IVar50);
      auVar37._8_56_ = extraout_var_28;
      local_2e8 = vmovlpd_avx(auVar37._0_16_);
      IVar48.high = in_stack_fffffffffffffa1c;
      IVar48.low = in_stack_fffffffffffffa18;
      auVar38._0_8_ = pbrt::operator*(in_stack_fffffffffffffa14,IVar48);
      auVar38._8_56_ = extraout_var_29;
      local_2e0 = vmovlpd_avx(auVar38._0_16_);
      local_2c0 = local_2e0;
    }
    else {
      local_2d8 = local_2b0;
      auVar35._0_8_ = Interval::operator-(this_00,IVar50);
      auVar35._8_56_ = extraout_var_26;
      local_2d0 = vmovlpd_avx(auVar35._0_16_);
      i_00.high = in_stack_fffffffffffffa1c;
      i_00.low = in_stack_fffffffffffffa18;
      auVar36._0_8_ = pbrt::operator*(in_stack_fffffffffffffa14,i_00);
      auVar36._8_56_ = extraout_var_27;
      local_2c8 = vmovlpd_avx(auVar36._0_16_);
      local_2c0 = local_2c8;
    }
    local_300 = uVar2;
    auVar39._0_8_ = Interval::operator/(this_02,i_01);
    auVar39._8_56_ = extraout_var_30;
    local_2f8 = (Interval)vmovlpd_avx(auVar39._0_16_);
    local_310 = local_2c0;
    local_b8 = local_2f8;
    auVar40._0_8_ = Interval::operator/(this_02,i_01);
    auVar40._8_56_ = extraout_var_31;
    local_308 = (Interval)vmovlpd_avx(auVar40._0_16_);
    local_c0 = local_308;
    FVar4 = Interval::LowerBound(&local_b8);
    FVar5 = Interval::LowerBound(&local_c0);
    if (FVar5 < FVar4) {
      pstd::swap<pbrt::Interval>(&local_b8,&local_c0);
    }
    FVar4 = Interval::UpperBound(&local_b8);
    if ((local_1c < FVar4) || (FVar4 = Interval::LowerBound(&local_c0), FVar4 <= 0.0)) {
      memset(in_RDI,0,0x18);
      pstd::optional<pbrt::QuadricIntersection>::optional(in_RDI);
    }
    else {
      local_318 = local_b8;
      FVar4 = Interval::LowerBound(&local_318);
      if (FVar4 <= 0.0) {
        local_318 = local_c0;
        FVar4 = Interval::UpperBound(&local_318);
        if (local_1c < FVar4) {
          memset(in_RDI,0,0x18);
          pstd::optional<pbrt::QuadricIntersection>::optional(in_RDI);
          return poVar53;
        }
      }
      local_348 = local_38;
      local_358 = local_48;
      uStack_350 = uStack_40;
      puVar52 = local_334;
      p_00.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = in_stack_fffffffffffffa28;
      p_00.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x = in_stack_fffffffffffffa20;
      p_00.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = (Float)in_stack_fffffffffffffa2c;
      p_00.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low = (Float)(int)puVar52;
      p_00.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high = (Float)((ulong)puVar52 >> 0x20);
      Point3<float>::Point3<pbrt::Interval>
                ((Point3<float> *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),p_00
                );
      FVar4 = Interval::operator_cast_to_float((Interval *)0x6a598d);
      local_398 = local_68;
      local_3a8 = local_78;
      IStack_3a0 = IStack_70;
      v_01.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.y.low = in_stack_fffffffffffffa28;
      v_01.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x = in_stack_fffffffffffffa20;
      v_01.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.y.high = FVar4;
      v_01.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.z.low = (Float)(int)puVar52;
      v_01.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.z.high = (Float)((ulong)puVar52 >> 0x20);
      IVar48 = local_78;
      IVar49 = IStack_70;
      this_01 = local_68;
      Vector3<float>::Vector3<pbrt::Interval>
                ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                 v_01);
      auVar45 = (undefined1  [56])0x0;
      local_370 = local_37c;
      local_378 = local_384;
      local_3b0 = local_37c;
      local_3b8 = local_384;
      t_00.y = FVar4;
      t_00.x = in_stack_fffffffffffffa28;
      t_00.z = SUB84(puVar52,0);
      VVar46 = pbrt::operator*(in_stack_fffffffffffffa14,t_00);
      local_3d0 = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar41._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar41._8_56_ = auVar45;
      local_3d8 = vmovlpd_avx(auVar41._0_16_);
      auVar45 = ZEXT856(0);
      VVar46.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffa28;
      VVar46.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffa20.low;
      VVar46.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffffa20.high;
      local_3c8 = local_3d8;
      local_3c0 = local_3d0;
      local_368 = local_3d8;
      local_360 = local_3d0;
      PVar47 = Point3<float>::operator+(this_01,VVar46);
      local_3f0 = PVar47.super_Tuple3<pbrt::Point3,_float>.z;
      auVar42._0_8_ = PVar47.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar42._8_56_ = auVar45;
      local_3f8 = vmovlpd_avx(auVar42._0_16_);
      fVar1 = *in_RSI;
      local_3e8 = local_3f8;
      local_3e0 = local_3f0;
      local_328 = local_3f8;
      local_320 = local_3f0;
      local_30 = local_3f8;
      local_28 = local_3f0;
      Point3<float>::Point3((Point3<float> *)IVar49,IVar48.high,IVar48.low,0.0);
      local_410 = local_3f0;
      local_418 = local_3f8;
      local_420 = local_3fc;
      local_428 = local_404;
      p1.super_Tuple3<pbrt::Point3,_float>.z = fVar56;
      p1.super_Tuple3<pbrt::Point3,_float>.x = i_01.low;
      p1.super_Tuple3<pbrt::Point3,_float>.y = i_01.high;
      PVar47.super_Tuple3<pbrt::Point3,_float>.z = fVar55;
      PVar47.super_Tuple3<pbrt::Point3,_float>._0_8_ = puVar54;
      tVar6 = Distance<float>(p1,PVar47);
      Tuple3<pbrt::Point3,float>::operator*=((Tuple3<pbrt::Point3,float> *)&local_30,fVar1 / tVar6);
      if (((float)local_30 == 0.0) && (!NAN((float)local_30))) {
        if ((local_30._4_4_ == 0.0) && (!NAN(local_30._4_4_))) {
          local_30 = CONCAT44(local_30._4_4_,*in_RSI * 1e-05);
        }
      }
      dVar7 = std::atan2((double)(local_30 >> 0x20),(double)(local_30 & 0xffffffff));
      local_20 = SUB84(dVar7,0);
      if (local_20 < 0.0) {
        local_20 = local_20 + 6.2831855;
      }
      if ((((-*in_RSI < in_RSI[1]) && (local_28 < in_RSI[1])) ||
          ((in_RSI[2] < *in_RSI && (in_RSI[2] < local_28)))) || (in_RSI[5] < local_20)) {
        local_430 = local_c0;
        bVar3 = Interval::operator==(&local_318,local_c0);
        if (bVar3) {
          memset(in_RDI,0,0x18);
          pstd::optional<pbrt::QuadricIntersection>::optional(in_RDI);
          return poVar53;
        }
        FVar5 = Interval::UpperBound(&local_c0);
        if (local_1c < FVar5) {
          memset(in_RDI,0,0x18);
          pstd::optional<pbrt::QuadricIntersection>::optional(in_RDI);
          return poVar53;
        }
        local_318 = local_c0;
        puVar51 = local_44c;
        p_01.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = in_stack_fffffffffffffa28;
        p_01.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x = (Interval)puVar51;
        p_01.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = FVar4;
        p_01.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low = (Float)(int)puVar52;
        p_01.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high = (Float)((ulong)puVar52 >> 0x20);
        Point3<float>::Point3<pbrt::Interval>
                  ((Point3<float> *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                   p_01);
        Interval::operator_cast_to_float((Interval *)0x6a5dc4);
        v_02.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.y.low = in_stack_fffffffffffffa28;
        v_02.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x = (Interval)puVar51;
        v_02.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.y.high = FVar4;
        v_02.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.z.low = (Float)(int)puVar52;
        v_02.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.z.high = (Float)((ulong)puVar52 >> 0x20);
        Vector3<float>::Vector3<pbrt::Interval>
                  ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                   v_02);
        auVar45 = (undefined1  [56])0x0;
        t_01.y = FVar4;
        t_01.x = in_stack_fffffffffffffa28;
        t_01.z = SUB84(puVar52,0);
        VVar46 = pbrt::operator*(in_stack_fffffffffffffa14,t_01);
        auVar43._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar43._8_56_ = auVar45;
        vmovlpd_avx(auVar43._0_16_);
        auVar45 = ZEXT856(0);
        v_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffa28;
        v_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ = puVar51;
        PVar47 = Point3<float>::operator+(local_68,v_00);
        local_438 = PVar47.super_Tuple3<pbrt::Point3,_float>.z;
        auVar44._0_8_ = PVar47.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar44._8_56_ = auVar45;
        local_440 = vmovlpd_avx(auVar44._0_16_);
        FVar4 = *in_RSI;
        local_30 = local_440;
        local_28 = local_438;
        Point3<float>::Point3((Point3<float> *)IStack_70,local_78.high,local_78.low,0.0);
        p1_00.super_Tuple3<pbrt::Point3,_float>.z = fVar56;
        p1_00.super_Tuple3<pbrt::Point3,_float>.x = i_01.low;
        p1_00.super_Tuple3<pbrt::Point3,_float>.y = i_01.high;
        p2.super_Tuple3<pbrt::Point3,_float>.z = fVar55;
        p2.super_Tuple3<pbrt::Point3,_float>._0_8_ = puVar54;
        tVar6 = Distance<float>(p1_00,p2);
        Tuple3<pbrt::Point3,float>::operator*=
                  ((Tuple3<pbrt::Point3,float> *)&local_30,FVar4 / tVar6);
        if (((float)local_30 == 0.0) && (!NAN((float)local_30))) {
          if ((local_30._4_4_ == 0.0) && (!NAN(local_30._4_4_))) {
            local_30 = CONCAT44(local_30._4_4_,*in_RSI * 1e-05);
          }
        }
        dVar7 = std::atan2((double)(local_30 >> 0x20),(double)(local_30 & 0xffffffff));
        local_20 = SUB84(dVar7,0);
        if (local_20 < 0.0) {
          local_20 = local_20 + 6.2831855;
        }
        if ((((-*in_RSI < in_RSI[1]) && (local_28 < in_RSI[1])) ||
            ((in_RSI[2] < *in_RSI && (in_RSI[2] < local_28)))) ||
           (IVar48 = local_78, IVar49 = IStack_70, in_RSI[5] < local_20)) {
          memset(in_RDI,0,0x18);
          pstd::optional<pbrt::QuadricIntersection>::optional(in_RDI);
          return poVar53;
        }
      }
      Interval::operator_cast_to_float((Interval *)0x6a6132);
      pstd::optional<pbrt::QuadricIntersection>::optional
                ((optional<pbrt::QuadricIntersection> *)IVar49,(QuadricIntersection *)IVar48);
    }
  }
  return poVar53;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<QuadricIntersection> BasicIntersect(const Ray &r, Float tMax) const {
        Float phi;
        Point3f pHit;
        // Transform _Ray_ origin and direction to object space
        Point3fi oi = (*objectFromRender)(Point3fi(r.o));
        Vector3fi di = (*objectFromRender)(Vector3fi(r.d));

        // Solve quadratic equation to compute sphere _t0_ and _t1_
        Interval t0, t1;
        // Compute sphere quadratic coefficients
        Interval a = Sqr(di.x) + Sqr(di.y) + Sqr(di.z);
        Interval b = 2 * (di.x * oi.x + di.y * oi.y + di.z * oi.z);
        Interval c = Sqr(oi.x) + Sqr(oi.y) + Sqr(oi.z) - Sqr(Interval(radius));

        // Compute sphere quadratic discriminant _discrim_
        Vector3fi v(oi - b / (2 * a) * di);
        Interval length = Length(v);
        Interval discrim =
            4 * a * (Interval(radius) + length) * (Interval(radius) - length);
        if (discrim.LowerBound() < 0)
            return {};

        // Compute quadratic $t$ values
        Interval rootDiscrim = Sqrt(discrim);
        Interval q;
        if ((Float)b < 0)
            q = -.5f * (b - rootDiscrim);
        else
            q = -.5f * (b + rootDiscrim);
        t0 = q / a;
        t1 = c / q;
        // Swap quadratic $t$ values so that _t0_ is the lesser
        if (t0.LowerBound() > t1.LowerBound())
            pstd::swap(t0, t1);

        // Check quadric shape _t0_ and _t1_ for nearest intersection
        if (t0.UpperBound() > tMax || t1.LowerBound() <= 0)
            return {};
        Interval tShapeHit = t0;
        if (tShapeHit.LowerBound() <= 0) {
            tShapeHit = t1;
            if (tShapeHit.UpperBound() > tMax)
                return {};
        }

        // Compute sphere hit position and $\phi$
        pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
        // Refine sphere intersection point
        pHit *= radius / Distance(pHit, Point3f(0, 0, 0));

        if (pHit.x == 0 && pHit.y == 0)
            pHit.x = 1e-5f * radius;
        phi = std::atan2(pHit.y, pHit.x);
        if (phi < 0)
            phi += 2 * Pi;

        // Test sphere intersection against clipping parameters
        if ((zMin > -radius && pHit.z < zMin) || (zMax < radius && pHit.z > zMax) ||
            phi > phiMax) {
            if (tShapeHit == t1)
                return {};
            if (t1.UpperBound() > tMax)
                return {};
            tShapeHit = t1;
            // Compute sphere hit position and $\phi$
            pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
            // Refine sphere intersection point
            pHit *= radius / Distance(pHit, Point3f(0, 0, 0));

            if (pHit.x == 0 && pHit.y == 0)
                pHit.x = 1e-5f * radius;
            phi = std::atan2(pHit.y, pHit.x);
            if (phi < 0)
                phi += 2 * Pi;

            if ((zMin > -radius && pHit.z < zMin) || (zMax < radius && pHit.z > zMax) ||
                phi > phiMax)
                return {};
        }

        // Return _QuadricIntersection_ for sphere intersection
        return QuadricIntersection{Float(tShapeHit), pHit, phi};
    }